

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microterm.cpp
# Opt level: O1

void __thiscall MicroTerm::connectionClosed(MicroTerm *this,Stream *stream,bool abnormal)

{
  ostream *poVar1;
  string local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Closed connection ",0x12);
  Dashel::Stream::getTargetName_abi_cxx11_(&local_48,stream);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_48._M_dataplus._M_p,local_48._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  if (abnormal) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," : ",3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,*(char **)(stream + 0x10),*(long *)(stream + 0x18));
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
  std::ostream::put(-0x60);
  std::ostream::flush();
  Dashel::Hub::stop();
  return;
}

Assistant:

void connectionClosed(Stream* stream, bool abnormal)
	{
		cout << "Closed connection " << stream->getTargetName() << " (" << stream << ")";
		if (abnormal)
			cout << " : " << stream->getFailReason();
		cout << endl;
		stop();
	}